

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall
Cache::Cache(Cache *this,MemoryManager *manager,Policy policy,Cache *lower_cache,bool write_back,
            bool write_allocate,uint32_t mct_size)

{
  bool bVar1;
  undefined8 extraout_RAX;
  Cache *this_00;
  vector<Cache::Block,_std::allocator<Cache::Block>_> *unaff_R15;
  undefined1 auVar2 [16];
  
  this->mct = (uint64_t **)0x0;
  this->pre_fetch = false;
  *(undefined8 *)((long)&(this->policy).cache_size + 1) = 0;
  *(undefined8 *)((long)&(this->policy).block_num + 1) = 0;
  *(undefined8 *)((long)&(this->policy).hit_latency + 1) = 0;
  *(undefined8 *)((long)&this->plru_bit + 1) = 0;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->policy).cache_size = 0;
  (this->policy).block_size = 0;
  auVar2 = ZEXT416(0) << 0x40;
  this->pre_fetch_num = auVar2._0_4_;
  (this->statistics).read_cnt = auVar2._4_4_;
  (this->statistics).write_cnt = auVar2._8_4_;
  (this->statistics).hit_cnt = auVar2._12_4_;
  (this->statistics).miss_cnt = 0;
  (this->statistics).cycle_cnt = 0;
  this->memory = manager;
  this->mct_size = mct_size;
  (this->policy).cache_size = policy.cache_size;
  (this->policy).block_size = policy.block_size;
  (this->policy).block_num = policy.block_num;
  (this->policy).associativity = policy.associativity;
  (this->policy).hit_latency = policy.hit_latency;
  this->lower_cache = lower_cache;
  this->reference_cnt = 0;
  this_00 = this;
  bVar1 = policyValid(this);
  if (bVar1) {
    initCache(this);
    this->write_allocate = write_allocate;
    this->write_back = write_back;
    return;
  }
  Cache(this_00);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(unaff_R15);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Cache::Cache(MemoryManager *manager, Policy policy, Cache *lower_cache,
             bool write_back, bool write_allocate, uint32_t mct_size) {
    this->memory = manager;
    this->mct_size = mct_size;
    this->policy = policy;
    this->lower_cache = lower_cache;
    this->reference_cnt = 0;
    if (!this->policyValid()) {
        fprintf(stderr, "Policy invalid\n");
        exit(-1);
    }
    this->initCache();
    this->write_allocate = write_allocate;
    this->write_back = write_back;
}